

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

string * __thiscall
BayesianGameBase::SoftPrintType_abi_cxx11_
          (string *__return_storage_ptr__,BayesianGameBase *this,Index agentI,Index typeIndex)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"BGType");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

string BayesianGameBase::SoftPrintType(Index agentI, Index typeIndex) const
{
    stringstream ss;
    ss << "BGType"<<typeIndex;
    return(ss.str());
}